

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O2

void set_txfm_context(MACROBLOCKD *xd,TX_SIZE tx_size,int blk_row,int blk_col)

{
  BLOCK_SIZE bsize;
  byte tx_size_00;
  MB_MODE_INFO *pMVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  TX_SIZE tx_size_01;
  int plane;
  int col;
  int iVar5;
  TXFM_CONTEXT *left_ctx;
  TXFM_CONTEXT *above_ctx;
  int iVar6;
  int iVar7;
  
  pMVar1 = *xd->mi;
  bsize = pMVar1->bsize;
  iVar2 = max_block_high(xd,bsize,blk_row);
  iVar3 = max_block_wide(xd,bsize,plane);
  iVar7 = iVar2 - blk_row;
  iVar6 = iVar3 - blk_col;
  if ((iVar6 == 0 || iVar3 < blk_col) || (iVar7 == 0 || iVar2 < blk_row)) {
    return;
  }
  iVar2 = (blk_col >> (av1_get_txb_size_index_tw_w_log2_table[bsize] & 0x1f)) +
          ((blk_row >> (av1_get_txb_size_index_tw_h_log2_table[bsize] & 0x1f)) <<
          (av1_get_txb_size_index_stride_log2_table[bsize] & 0x1f));
  if (pMVar1->inter_tx_size[iVar2] == tx_size) {
    pMVar1->tx_size = tx_size;
    above_ctx = xd->above_txfm_context + blk_col;
    left_ctx = xd->left_txfm_context + blk_row;
    tx_size_01 = tx_size;
  }
  else {
    if (tx_size != '\x01') {
      tx_size_00 = ""[tx_size];
      iVar2 = tx_size_wide_unit[tx_size_00];
      iVar3 = tx_size_high_unit[tx_size_00];
      if (tx_size_high_unit[tx_size] < iVar7) {
        iVar7 = tx_size_high_unit[tx_size];
      }
      if (tx_size_wide_unit[tx_size] < iVar6) {
        iVar6 = tx_size_wide_unit[tx_size];
      }
      for (iVar4 = 0; iVar4 < iVar7; iVar4 = iVar4 + iVar3) {
        for (iVar5 = 0; iVar5 < iVar6; iVar5 = iVar5 + iVar2) {
          set_txfm_context(xd,tx_size_00,iVar4 + blk_row,blk_col + iVar5);
        }
      }
      return;
    }
    pMVar1->inter_tx_size[iVar2] = '\0';
    pMVar1->tx_size = '\0';
    above_ctx = xd->above_txfm_context + blk_col;
    left_ctx = xd->left_txfm_context + blk_row;
    tx_size = '\x01';
    tx_size_01 = '\0';
  }
  txfm_partition_update(above_ctx,left_ctx,tx_size_01,tx_size);
  return;
}

Assistant:

static void set_txfm_context(MACROBLOCKD *xd, TX_SIZE tx_size, int blk_row,
                             int blk_col) {
  MB_MODE_INFO *mbmi = xd->mi[0];
  const BLOCK_SIZE bsize = mbmi->bsize;
  const int max_blocks_high = max_block_high(xd, bsize, 0);
  const int max_blocks_wide = max_block_wide(xd, bsize, 0);
  const int txb_size_index = av1_get_txb_size_index(bsize, blk_row, blk_col);
  const TX_SIZE plane_tx_size = mbmi->inter_tx_size[txb_size_index];

  if (blk_row >= max_blocks_high || blk_col >= max_blocks_wide) return;

  if (tx_size == plane_tx_size) {
    mbmi->tx_size = tx_size;
    txfm_partition_update(xd->above_txfm_context + blk_col,
                          xd->left_txfm_context + blk_row, tx_size, tx_size);

  } else {
    if (tx_size == TX_8X8) {
      mbmi->inter_tx_size[txb_size_index] = TX_4X4;
      mbmi->tx_size = TX_4X4;
      txfm_partition_update(xd->above_txfm_context + blk_col,
                            xd->left_txfm_context + blk_row, TX_4X4, tx_size);
      return;
    }
    const TX_SIZE sub_txs = sub_tx_size_map[tx_size];
    const int bsw = tx_size_wide_unit[sub_txs];
    const int bsh = tx_size_high_unit[sub_txs];
    const int row_end =
        AOMMIN(tx_size_high_unit[tx_size], max_blocks_high - blk_row);
    const int col_end =
        AOMMIN(tx_size_wide_unit[tx_size], max_blocks_wide - blk_col);
    for (int row = 0; row < row_end; row += bsh) {
      const int offsetr = blk_row + row;
      for (int col = 0; col < col_end; col += bsw) {
        const int offsetc = blk_col + col;
        set_txfm_context(xd, sub_txs, offsetr, offsetc);
      }
    }
  }
}